

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

vec2f __thiscall hmi::renderer::get_coords_from_position(renderer *this,vec2i position)

{
  vec2f point;
  int iVar1;
  float fVar2;
  float fVar3;
  vec_accessor<float,_2UL,_0UL> vVar4;
  mat3f inverse_transform;
  vec2f normalized;
  vec2f viewport_size;
  vec2f viewport_position;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  vec<float,_2UL> *in_stack_ffffffffffffff30;
  vec_accessor *this_00;
  renderer *this_01;
  mat3f *mat;
  undefined4 in_stack_ffffffffffffff58;
  float fVar5;
  renderer *in_stack_ffffffffffffffa0;
  mat<float,_3UL> *in_stack_ffffffffffffffc0;
  undefined1 local_38 [24];
  undefined1 local_20 [32];
  
  this_01 = (renderer *)local_20;
  vec<float,_2UL>::vec((vec<float,_2UL> *)this_01,0.0,0.0);
  local_38._8_8_ = get_size(this_01);
  vec<float,_2UL>::vec<int>
            (in_stack_ffffffffffffff30,
             (vec<int,_2UL> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  mat = (mat3f *)local_38;
  vec<float,_2UL>::vec((vec<float,_2UL> *)mat);
  this_00 = (vec_accessor *)(local_20 + 0x10);
  iVar1 = vec_accessor::operator_cast_to_int(this_00);
  fVar2 = (float)iVar1;
  fVar3 = vec_accessor::operator_cast_to_float((vec_accessor *)this_01);
  fVar2 = (fVar2 - fVar3) + (fVar2 - fVar3);
  fVar3 = vec_accessor::operator_cast_to_float((vec_accessor *)(local_38 + 0x10));
  fVar5 = 1.0;
  vec_accessor<float,_2UL,_0UL>::operator=((vec_accessor<float,_2UL,_0UL> *)mat,fVar2 / fVar3 - 1.0)
  ;
  iVar1 = vec_accessor::operator_cast_to_int(this_00);
  fVar2 = vec_accessor::operator_cast_to_float((vec_accessor *)this_01);
  fVar3 = vec_accessor::operator_cast_to_float((vec_accessor *)(local_38 + 0x10));
  vec_accessor<float,_2UL,_1UL>::operator=
            ((vec_accessor<float,_2UL,_1UL> *)mat,
             fVar5 - (((float)iVar1 - fVar2) + ((float)iVar1 - fVar2)) / fVar3);
  get_view_matrix(in_stack_ffffffffffffffa0);
  invert<float>(in_stack_ffffffffffffffc0);
  point.field_0.data[1] = fVar5;
  point.field_0.data[0] = (float)in_stack_ffffffffffffff58;
  vVar4.data = (float  [2])anon_unknown_0::affine_transform(mat,point);
  return (vec2f)(vec_accessor<float,_2UL,_0UL>)vVar4.data;
}

Assistant:

vec2f renderer::get_coords_from_position(vec2i position) {
    vec2f viewport_position = { 0.0f, 0.0f };
    vec2f viewport_size = get_size();

    vec2f normalized;
    normalized.x = 2.0f * (position.x - viewport_position.x) / viewport_size.width - 1;
    normalized.y = 1 - 2.0f * (position.y - viewport_position.y) / viewport_size.height;

    mat3f inverse_transform = invert(get_view_matrix());

    return affine_transform(inverse_transform, normalized);
  }